

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

int VP8EncTokenLoop(VP8Encoder *enc)

{
  VP8EncProba *proba;
  VP8TBuffer *b;
  ProbaArray (*probas) [8];
  int iVar1;
  VP8RDLevel rd_opt;
  int iVar2;
  VP8Encoder *enc_00;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint ok;
  int16_t (*paiVar10) [16];
  int16_t (*paiVar11) [16];
  int *piVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int16_t (*paiVar16) [16];
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  PassStats stats;
  VP8ModeScore info;
  VP8EncIterator it;
  int local_13a4;
  long local_1388;
  long local_1380;
  PassStats local_1320;
  double local_12e8;
  double dStack_12e0;
  VP8Residual local_12d8;
  VP8ModeScore local_12a8;
  VP8EncIterator local_f38;
  
  iVar5 = enc->mb_w_;
  iVar7 = enc->mb_h_;
  iVar13 = enc->config_->pass;
  iVar1 = enc->do_search_;
  rd_opt = enc->rd_opt_level_;
  InitPassStats(enc,&local_1320);
  iVar3 = PreLoopInitialize(enc);
  if (iVar3 == 0) {
    iVar5 = 0;
  }
  else {
    proba = &enc->proba_;
    lVar14 = (long)iVar7 * (long)iVar5;
    lVar15 = lVar14 * 0x180;
    iVar7 = (int)lVar14;
    iVar3 = iVar7 >> 3;
    iVar5 = 0x60;
    if (0x60 < iVar3) {
      iVar5 = iVar3;
    }
    b = &enc->tokens_;
    auVar22._8_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar22._0_8_ = lVar15;
    auVar22._12_4_ = 0x45300000;
    dStack_12e0 = auVar22._8_8_ - 1.9342813113834067e+25;
    probas = (enc->proba_).coeffs_;
    local_12e8 = (dStack_12e0 + ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) *
                 65025.0;
    uVar4 = 1;
    do {
      if (uVar4 == 0) {
        uVar4 = 0;
        break;
      }
      if (iVar13 < 1) {
        uVar4 = 1;
        break;
      }
      iVar3 = iVar13 + -1;
      bVar19 = true;
      if ((0.4 < ABS(local_1320.dq)) && (iVar3 != 0)) {
        bVar19 = enc->max_i4_header_bits_ == 0;
      }
      VP8IteratorInit(enc,&local_f38);
      SetLoopParams(enc,local_1320.q);
      if (bVar19) {
        memset((enc->proba_).stats_,0,0x1080);
        VP8InitFilter(&local_f38);
      }
      VP8TBufferClear(b);
      local_1380 = 0;
      local_1388 = 0;
      local_13a4 = iVar5;
      do {
        VP8IteratorImport(&local_f38,(uint8_t *)0x0);
        if (local_13a4 < 1) {
          FinalizeTokenProbas(proba);
          VP8CalculateLevelCosts(proba);
          local_13a4 = iVar5;
        }
        else {
          local_13a4 = local_13a4 + -1;
        }
        VP8Decimate(&local_f38,&local_12a8,rd_opt);
        enc_00 = local_f38.enc_;
        VP8IteratorNzToBytes(&local_f38);
        bVar20 = ((uint)*local_f38.mb_ & 3) != 1;
        if (bVar20) {
          iVar9 = 3;
        }
        else {
          iVar9 = local_f38.left_nz_[8] + local_f38.top_nz_[8];
          VP8InitResidual(0,1,enc_00,&local_12d8);
          (*VP8SetResidualCoeffs)(local_12a8.y_dc_levels,&local_12d8);
          local_f38.top_nz_[8] = VP8RecordCoeffTokens(iVar9,&local_12d8,b);
          iVar9 = 0;
          local_f38.left_nz_[8] = local_f38.top_nz_[8];
        }
        VP8InitResidual((uint)!bVar20,iVar9,enc_00,&local_12d8);
        paiVar10 = local_12a8.y_ac_levels;
        lVar15 = 0;
        do {
          lVar14 = 0x21;
          paiVar11 = paiVar10;
          do {
            iVar9 = local_f38.left_nz_[lVar15];
            iVar2 = *(int *)(local_f38.i4_boundary_ + lVar14 * 4 + -0x50);
            (*VP8SetResidualCoeffs)(*paiVar11,&local_12d8);
            iVar9 = VP8RecordCoeffTokens(iVar9 + iVar2,&local_12d8,b);
            local_f38.left_nz_[lVar15] = iVar9;
            *(int *)(local_f38.i4_boundary_ + lVar14 * 4 + -0x50) = iVar9;
            lVar14 = lVar14 + 1;
            paiVar11 = paiVar11 + 1;
          } while (lVar14 != 0x25);
          lVar15 = lVar15 + 1;
          paiVar10 = paiVar10 + 4;
        } while (lVar15 != 4);
        VP8InitResidual(0,2,enc_00,&local_12d8);
        piVar12 = local_f38.top_nz_ + 4;
        paiVar10 = local_12a8.uv_levels;
        uVar8 = 0;
        do {
          paiVar11 = paiVar10;
          uVar17 = 0;
          do {
            uVar18 = uVar17 | uVar8 | 4;
            lVar15 = 0;
            paiVar16 = paiVar11;
            do {
              iVar9 = local_f38.left_nz_[uVar18];
              iVar2 = piVar12[lVar15];
              (*VP8SetResidualCoeffs)(*paiVar16,&local_12d8);
              iVar9 = VP8RecordCoeffTokens(iVar9 + iVar2,&local_12d8,b);
              local_f38.left_nz_[uVar18] = iVar9;
              piVar12[lVar15] = iVar9;
              lVar15 = lVar15 + 1;
              paiVar16 = paiVar16 + 1;
            } while (lVar15 == 1);
            paiVar11 = paiVar11 + 2;
            bVar20 = uVar17 == 0;
            uVar17 = uVar17 + 1;
          } while (bVar20);
          paiVar10 = paiVar10 + 4;
          piVar12 = piVar12 + 2;
          bVar20 = uVar8 == 0;
          uVar8 = uVar8 + 2;
        } while (bVar20);
        VP8IteratorBytesToNz(&local_f38);
        iVar9 = (enc->tokens_).error_;
        if (iVar9 == 0) {
          local_1380 = local_1380 + local_12a8.H;
          local_1388 = local_1388 + local_12a8.D;
          if (bVar19) {
            StoreSideInfo(&local_f38);
            VP8StoreFilterStats(&local_f38);
            VP8IteratorExport(&local_f38);
            uVar4 = VP8IteratorProgress(&local_f38,0x14);
          }
          else {
            uVar4 = (uint)(iVar9 == 0);
          }
          VP8IteratorSaveBoundary(&local_f38);
        }
        else {
          WebPEncodingSetError(enc->pic_,VP8_ENC_ERROR_OUT_OF_MEMORY);
          uVar4 = 0;
        }
      } while (((iVar9 == 0) && (uVar4 != 0)) && (iVar9 = VP8IteratorNext(&local_f38), iVar9 != 0));
      if (uVar4 == 0) {
        bVar19 = true;
        iVar13 = iVar3;
      }
      else {
        uVar8 = local_1380 + (enc->segment_hdr_).size_;
        if (local_1320.do_size_search == 0) {
          dVar21 = 99.0;
          if (local_1388 != 0 && iVar7 != 0) {
            auVar23._8_4_ = (int)((ulong)local_1388 >> 0x20);
            auVar23._0_8_ = local_1388;
            auVar23._12_4_ = 0x45300000;
            dVar21 = log10(local_12e8 /
                           ((auVar23._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_1388) - 4503599627370496.0)));
            dVar21 = dVar21 * 10.0;
          }
        }
        else {
          iVar9 = FinalizeTokenProbas(proba);
          sVar6 = VP8EstimateTokenSize(b,(uint8_t *)probas);
          dVar21 = (double)((sVar6 + (long)iVar9 + uVar8 + 0x400 >> 0xb) + 0x1e);
        }
        local_1320.value = dVar21;
        if ((enc->max_i4_header_bits_ < 1) || (uVar8 < 0x3fc00001)) {
          iVar13 = iVar3;
          if (iVar1 != 0 && !bVar19) {
            ComputeNextQ(&local_1320);
            bVar19 = false;
          }
        }
        else {
          enc->max_i4_header_bits_ = (uint)enc->max_i4_header_bits_ >> 1;
          if (bVar19) {
            if ((local_f38.enc_)->pic_->stats != (WebPAuxStats *)0x0) {
              (local_f38.enc_)->block_count_[2] = 0;
              (local_f38.enc_)->block_count_[0] = 0;
              (local_f38.enc_)->block_count_[1] = 0;
            }
            (local_f38.enc_)->sse_count_ = 0;
            (local_f38.enc_)->sse_[0] = 0;
            (local_f38.enc_)->sse_[1] = 0;
            (local_f38.enc_)->sse_[2] = 0;
          }
          bVar19 = false;
        }
      }
    } while (!bVar19);
    ok = 0;
    if (uVar4 != 0) {
      if (local_1320.do_size_search == 0) {
        FinalizeTokenProbas(proba);
      }
      iVar5 = VP8EmitTokens(b,enc->parts_,(uint8_t *)probas,1);
      if (iVar5 != 0) {
        iVar5 = WebPReportProgress(enc->pic_,enc->percent_ + 0x14,&enc->percent_);
        ok = (uint)(iVar5 != 0);
      }
    }
    iVar5 = PostLoopFinalize(&local_f38,ok);
  }
  return iVar5;
}

Assistant:

int VP8EncTokenLoop(VP8Encoder* const enc) {
  // Roughly refresh the proba eight times per pass
  int max_count = (enc->mb_w_ * enc->mb_h_) >> 3;
  int num_pass_left = enc->config_->pass;
  const int do_search = enc->do_search_;
  VP8EncIterator it;
  VP8EncProba* const proba = &enc->proba_;
  const VP8RDLevel rd_opt = enc->rd_opt_level_;
  const uint64_t pixel_count = enc->mb_w_ * enc->mb_h_ * 384;
  PassStats stats;
  int ok;

  InitPassStats(enc, &stats);
  ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  if (max_count < MIN_COUNT) max_count = MIN_COUNT;

  assert(enc->num_parts_ == 1);
  assert(enc->use_tokens_);
  assert(proba->use_skip_proba_ == 0);
  assert(rd_opt >= RD_OPT_BASIC);   // otherwise, token-buffer won't be useful
  assert(num_pass_left > 0);

  while (ok && num_pass_left-- > 0) {
    const int is_last_pass = (fabs(stats.dq) <= DQ_LIMIT) ||
                             (num_pass_left == 0) ||
                             (enc->max_i4_header_bits_ == 0);
    uint64_t size_p0 = 0;
    uint64_t distortion = 0;
    int cnt = max_count;
    VP8IteratorInit(enc, &it);
    SetLoopParams(enc, stats.q);
    if (is_last_pass) {
      ResetTokenStats(enc);
      VP8InitFilter(&it);  // don't collect stats until last pass (too costly)
    }
    VP8TBufferClear(&enc->tokens_);
    do {
      VP8ModeScore info;
      VP8IteratorImport(&it, NULL);
      if (--cnt < 0) {
        FinalizeTokenProbas(proba);
        VP8CalculateLevelCosts(proba);  // refresh cost tables for rd-opt
        cnt = max_count;
      }
      VP8Decimate(&it, &info, rd_opt);
      ok = RecordTokens(&it, &info, &enc->tokens_);
      if (!ok) {
        WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
        break;
      }
      size_p0 += info.H;
      distortion += info.D;
      if (is_last_pass) {
        StoreSideInfo(&it);
        VP8StoreFilterStats(&it);
        VP8IteratorExport(&it);
        ok = VP8IteratorProgress(&it, 20);
      }
      VP8IteratorSaveBoundary(&it);
    } while (ok && VP8IteratorNext(&it));
    if (!ok) break;

    size_p0 += enc->segment_hdr_.size_;
    if (stats.do_size_search) {
      uint64_t size = FinalizeTokenProbas(&enc->proba_);
      size += VP8EstimateTokenSize(&enc->tokens_,
                                   (const uint8_t*)proba->coeffs_);
      size = (size + size_p0 + 1024) >> 11;  // -> size in bytes
      size += HEADER_SIZE_ESTIMATE;
      stats.value = (double)size;
    } else {  // compute and store PSNR
      stats.value = GetPSNR(distortion, pixel_count);
    }

#if (DEBUG_SEARCH > 0)
    printf("#%2d metric:%.1lf -> %.1lf   last_q=%.2lf q=%.2lf dq=%.2lf "
           " range:[%.1f, %.1f]\n",
           num_pass_left, stats.last_value, stats.value,
           stats.last_q, stats.q, stats.dq, stats.qmin, stats.qmax);
#endif
    if (enc->max_i4_header_bits_ > 0 && size_p0 > PARTITION0_SIZE_LIMIT) {
      ++num_pass_left;
      enc->max_i4_header_bits_ >>= 1;  // strengthen header bit limitation...
      if (is_last_pass) {
        ResetSideInfo(&it);
      }
      continue;                        // ...and start over
    }
    if (is_last_pass) {
      break;   // done
    }
    if (do_search) {
      ComputeNextQ(&stats);  // Adjust q
    }
  }
  if (ok) {
    if (!stats.do_size_search) {
      FinalizeTokenProbas(&enc->proba_);
    }
    ok = VP8EmitTokens(&enc->tokens_, enc->parts_ + 0,
                       (const uint8_t*)proba->coeffs_, 1);
  }
  ok = ok && WebPReportProgress(enc->pic_, enc->percent_ + 20, &enc->percent_);
  return PostLoopFinalize(&it, ok);
}